

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReshapeDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshapedynamic(NeuralNetworkLayer *this)

{
  ReshapeDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x479) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x479;
    this_00 = (ReshapeDynamicLayerParams *)operator_new(0x18);
    ReshapeDynamicLayerParams::ReshapeDynamicLayerParams(this_00);
    (this->layer_).reshapedynamic_ = this_00;
  }
  return (ReshapeDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeDynamicLayerParams* NeuralNetworkLayer::mutable_reshapedynamic() {
  if (!has_reshapedynamic()) {
    clear_layer();
    set_has_reshapedynamic();
    layer_.reshapedynamic_ = new ::CoreML::Specification::ReshapeDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshapeDynamic)
  return layer_.reshapedynamic_;
}